

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::fill_n<fmt::v11::basic_appender<char>,int,char>
          (basic_appender<char> out,int count,char *value)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (0 < count) {
    do {
      cVar1 = *value;
      uVar3 = (out.container)->size_ + 1;
      if ((out.container)->capacity_ < uVar3) {
        (*(out.container)->grow_)(out.container,uVar3);
      }
      sVar2 = (out.container)->size_;
      (out.container)->size_ = sVar2 + 1;
      (out.container)->ptr_[sVar2] = cVar1;
      count = count + -1;
    } while (count != 0);
  }
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}